

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbi_cache.cpp
# Opt level: O1

bool __thiscall
icu_63::RuleBasedBreakIterator::BreakCache::addPreceding
          (BreakCache *this,int32_t position,int32_t ruleStatusIdx,UpdatePositionValues update)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = this->fEndBufIdx;
  uVar2 = this->fStartBufIdx - 1U & 0x7f;
  if (uVar2 == uVar1) {
    if ((update == RetainCachePosition) && (this->fBufIdx == uVar1)) {
      return false;
    }
    this->fEndBufIdx = uVar1 - 1 & 0x7f;
  }
  this->fBoundaries[uVar2] = position;
  this->fStatuses[uVar2] = (uint16_t)ruleStatusIdx;
  this->fStartBufIdx = uVar2;
  if (update != UpdateCachePosition) {
    return true;
  }
  this->fBufIdx = uVar2;
  this->fTextIdx = position;
  return true;
}

Assistant:

bool RuleBasedBreakIterator::BreakCache::addPreceding(int32_t position, int32_t ruleStatusIdx, UpdatePositionValues update) {
    U_ASSERT(position < fBoundaries[fStartBufIdx]);
    U_ASSERT(ruleStatusIdx <= UINT16_MAX);
    int32_t nextIdx = modChunkSize(fStartBufIdx - 1);
    if (nextIdx == fEndBufIdx) {
        if (fBufIdx == fEndBufIdx && update == RetainCachePosition) {
            // Failure. The insertion of the new boundary would claim the buffer position that is the
            // current iteration position. And we also want to retain the current iteration position.
            // (The buffer is already completely full of entries that precede the iteration position.)
            return false;
        }
        fEndBufIdx = modChunkSize(fEndBufIdx - 1);
    }
    fBoundaries[nextIdx] = position;
    fStatuses[nextIdx] = static_cast<uint16_t>(ruleStatusIdx);
    fStartBufIdx = nextIdx;
    if (update == UpdateCachePosition) {
        fBufIdx = nextIdx;
        fTextIdx = position;
    }
    return true;
}